

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

string * __thiscall
ELFIO::dump::format_assoc<ELFIO::dynamic_tag_t[55],unsigned_long>
          (string *__return_storage_ptr__,dump *this,dynamic_tag_t (*table) [55],unsigned_long *key)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream oss;
  unsigned_long *key_local;
  dynamic_tag_t (*table_local) [55];
  string *str;
  
  find_value_in_table<ELFIO::dynamic_tag_t[55],unsigned_long>(__return_storage_ptr__,this,table,key)
  ;
  bVar1 = std::operator==(__return_storage_ptr__,"?");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,(string *)__return_storage_ptr__);
    poVar2 = std::operator<<(poVar2," (0x");
    this_00 = (void *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,*(ulong *)*table);
    std::operator<<(poVar2,")");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string format_assoc( const T& table, const K& key )
    {
        std::string str = find_value_in_table( table, key );
        if ( str == "?" ) {
            std::ostringstream oss;
            oss << str << " (0x" << std::hex << key << ")";
            str = oss.str();
        }

        return str;
    }